

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

void stbi__pnm_skip_whitespace(stbi__context *s,char *c)

{
  stbi_uc sVar1;
  int iVar2;
  stbi_uc *psVar3;
  
LAB_00127155:
  do {
    if ((s->io).read != (_func_int_void_ptr_char_ptr_int *)0x0) {
      iVar2 = (*(s->io).eof)(s->io_user_data);
      if (iVar2 == 0) goto LAB_0012717f;
      if (s->read_from_callbacks != 0) goto LAB_0012716f;
LAB_001271ca:
      if ((s->io).read != (_func_int_void_ptr_char_ptr_int *)0x0) {
        iVar2 = (*(s->io).eof)(s->io_user_data);
        if (iVar2 == 0) goto LAB_001271fc;
        if (s->read_from_callbacks == 0) {
          return;
        }
      }
      if (s->img_buffer_end <= s->img_buffer) {
        return;
      }
LAB_001271fc:
      if (*c != '#') {
        return;
      }
      do {
        if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_00127223:
          if (s->img_buffer_end <= s->img_buffer) goto LAB_00127155;
        }
        else {
          iVar2 = (*(s->io).eof)(s->io_user_data);
          if (iVar2 != 0) {
            if (s->read_from_callbacks != 0) goto LAB_00127223;
            goto LAB_00127155;
          }
        }
        if ((*c == '\n') || (*c == '\r')) goto LAB_00127155;
        psVar3 = s->img_buffer;
        if (psVar3 < s->img_buffer_end) {
LAB_00127272:
          s->img_buffer = psVar3 + 1;
          sVar1 = *psVar3;
        }
        else {
          if (s->read_from_callbacks != 0) {
            stbi__refill_buffer(s);
            psVar3 = s->img_buffer;
            goto LAB_00127272;
          }
          sVar1 = '\0';
        }
        *c = sVar1;
      } while( true );
    }
LAB_0012716f:
    if (s->img_buffer_end <= s->img_buffer) goto LAB_001271ca;
LAB_0012717f:
    if ((4 < (byte)*c - 9) && (*c != 0x20)) goto LAB_001271ca;
    psVar3 = s->img_buffer;
    if (psVar3 < s->img_buffer_end) {
LAB_001271b4:
      s->img_buffer = psVar3 + 1;
      sVar1 = *psVar3;
    }
    else {
      if (s->read_from_callbacks != 0) {
        stbi__refill_buffer(s);
        psVar3 = s->img_buffer;
        goto LAB_001271b4;
      }
      sVar1 = '\0';
    }
    *c = sVar1;
  } while( true );
}

Assistant:

static void     stbi__pnm_skip_whitespace(stbi__context *s, char *c)
{
   for (;;) {
      while (!stbi__at_eof(s) && stbi__pnm_isspace(*c))
         *c = (char) stbi__get8(s);

      if (stbi__at_eof(s) || *c != '#')
         break;

      while (!stbi__at_eof(s) && *c != '\n' && *c != '\r' )
         *c = (char) stbi__get8(s);
   }
}